

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O1

_Bool IsFileExtension(char *fileName,char *ext)

{
  int iVar1;
  char *pcVar2;
  char **ppcVar3;
  bool bVar4;
  long lVar5;
  int extCount;
  char fileExtLower [17];
  int local_4c;
  char local_48 [32];
  
  pcVar2 = strrchr(fileName,0x2e);
  if (pcVar2 == (char *)0x0 || pcVar2 == fileName) {
    bVar4 = false;
  }
  else {
    local_4c = 0;
    ppcVar3 = TextSplit(ext,';',&local_4c);
    local_48[0] = '\0';
    local_48[1] = '\0';
    local_48[2] = '\0';
    local_48[3] = '\0';
    local_48[4] = '\0';
    local_48[5] = '\0';
    local_48[6] = '\0';
    local_48[7] = '\0';
    local_48[8] = '\0';
    local_48[9] = '\0';
    local_48[10] = '\0';
    local_48[0xb] = '\0';
    local_48[0xc] = '\0';
    local_48[0xd] = '\0';
    local_48[0xe] = '\0';
    local_48[0xf] = '\0';
    local_48[0x10] = 0;
    pcVar2 = TextToLower(pcVar2);
    strncpy(local_48,pcVar2,0x10);
    bVar4 = 0 < local_4c;
    if (0 < local_4c) {
      pcVar2 = TextToLower(*ppcVar3);
      iVar1 = strcmp(local_48,pcVar2);
      if (iVar1 != 0) {
        lVar5 = 1;
        do {
          bVar4 = lVar5 < local_4c;
          if (local_4c <= lVar5) {
            return bVar4;
          }
          pcVar2 = TextToLower(ppcVar3[lVar5]);
          iVar1 = strcmp(local_48,pcVar2);
          lVar5 = lVar5 + 1;
        } while (iVar1 != 0);
      }
    }
  }
  return bVar4;
}

Assistant:

bool IsFileExtension(const char *fileName, const char *ext)
{
    #define MAX_FILE_EXTENSION_LENGTH  16

    bool result = false;
    const char *fileExt = GetFileExtension(fileName);

    if (fileExt != NULL)
    {
#if defined(SUPPORT_MODULE_RTEXT) && defined(SUPPORT_TEXT_MANIPULATION)
        int extCount = 0;
        const char **checkExts = TextSplit(ext, ';', &extCount); // WARNING: Module required: rtext

        char fileExtLower[MAX_FILE_EXTENSION_LENGTH + 1] = { 0 };
        strncpy(fileExtLower, TextToLower(fileExt), MAX_FILE_EXTENSION_LENGTH); // WARNING: Module required: rtext

        for (int i = 0; i < extCount; i++)
        {
            if (strcmp(fileExtLower, TextToLower(checkExts[i])) == 0)
            {
                result = true;
                break;
            }
        }
#else
        if (strcmp(fileExt, ext) == 0) result = true;
#endif
    }

    return result;
}